

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

MemoryRegion *
memory_map_io_ppc(uc_struct_conflict10 *uc,ram_addr_t begin,size_t size,uc_cb_mmio_read_t read_cb,
                 uc_cb_mmio_write_t write_cb,void *user_data_read,void *user_data_write)

{
  MemoryRegion *mr;
  MemoryRegion *subregion;
  undefined8 *puVar1;
  size_t sVar2;
  uint32_t uVar3;
  
  subregion = (MemoryRegion *)g_malloc(0xa0);
  puVar1 = (undefined8 *)g_malloc(0x70);
  *puVar1 = read_cb;
  puVar1[2] = write_cb;
  puVar1[1] = user_data_read;
  puVar1[3] = user_data_write;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[4] = mmio_read_wrapper;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[5] = mmio_write_wrapper;
  *(undefined4 *)(puVar1 + 8) = 0;
  memset(subregion,0,0xa0);
  subregion->uc = (uc_struct_conflict7 *)uc;
  (subregion->subregions).tqh_first = (MemoryRegion *)0x0;
  (subregion->subregions).tqh_circ.tql_prev = (QTailQLink *)&subregion->subregions;
  sVar2 = 0;
  if (size != 0xffffffffffffffff) {
    sVar2 = size;
  }
  *(ulong *)((long)&subregion->size + 8) = (ulong)(size == 0xffffffffffffffff);
  *(size_t *)&subregion->size = sVar2;
  subregion->ops = (MemoryRegionOps *)(puVar1 + 4);
  subregion->opaque = puVar1;
  subregion->terminates = true;
  subregion->enabled = true;
  uVar3 = (read_cb != (uc_cb_mmio_read_t)0x0) + 2;
  if (write_cb == (uc_cb_mmio_write_t)0x0) {
    uVar3 = (uint)(read_cb != (uc_cb_mmio_read_t)0x0);
  }
  subregion->destructor = mmio_region_destructor_uc;
  subregion->perms = uVar3;
  mr = uc->system_memory;
  subregion->priority = 0;
  memory_region_add_subregion_common(mr,begin,subregion);
  if (uc->cpu != (CPUState_conflict *)0x0) {
    tlb_flush_ppc(uc->cpu);
  }
  return subregion;
}

Assistant:

MemoryRegion *memory_map_io(struct uc_struct *uc, ram_addr_t begin, size_t size,
                            uc_cb_mmio_read_t read_cb, uc_cb_mmio_write_t write_cb,
                            void *user_data_read, void *user_data_write)
{
    MemoryRegion *mmio = g_new(MemoryRegion, 1);
    mmio_cbs* opaques = g_new(mmio_cbs, 1);
    MemoryRegionOps *ops = &opaques->ops;
    opaques->read = read_cb;
    opaques->write = write_cb;
    opaques->user_data_read = user_data_read;
    opaques->user_data_write = user_data_write;

    memset(ops, 0, sizeof(*ops));

    ops->read = mmio_read_wrapper;
    ops->read_with_attrs = NULL;
    ops->write = mmio_write_wrapper;
    ops->write_with_attrs = NULL;
    ops->endianness = DEVICE_NATIVE_ENDIAN;

    memory_region_init_io(uc, mmio, ops, opaques, size);

    mmio->destructor = mmio_region_destructor_uc;

    mmio->perms = 0;

    if (read_cb)
        mmio->perms |= UC_PROT_READ;

    if (write_cb)
        mmio->perms |= UC_PROT_WRITE;

    memory_region_add_subregion(uc->system_memory, begin, mmio);

    if (uc->cpu)
        tlb_flush(uc->cpu);

    return mmio;
}